

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::anon_unknown_0::
AssignDescriptorsHelper<google::protobuf::internal::MigrationSchema>::AssignMessageDescriptor
          (AssignDescriptorsHelper<google::protobuf::internal::MigrationSchema> *this,
          Descriptor *descriptor)

{
  int iVar1;
  MigrationSchema *pMVar2;
  uint32 *puVar3;
  GeneratedMessageReflection *this_00;
  DescriptorPool *pool;
  Metadata *pMVar4;
  EnumDescriptor **ppEVar5;
  int *piVar6;
  long lVar7;
  long lVar8;
  ReflectionSchema result;
  ReflectionSchema local_50;
  
  if (0 < *(int *)(descriptor + 0x48)) {
    lVar8 = 0;
    lVar7 = 0;
    do {
      AssignMessageDescriptor(this,(Descriptor *)(*(long *)(descriptor + 0x50) + lVar8));
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 0xa8;
    } while (lVar7 < *(int *)(descriptor + 0x48));
  }
  pMVar4 = this->file_level_metadata_;
  pMVar4->descriptor = descriptor;
  if (*(char *)(*(long *)(descriptor + 0x20) + 0x6b) == '\0') {
    this_00 = (GeneratedMessageReflection *)operator_new(0x58);
    pMVar2 = this->schemas_;
    puVar3 = this->offsets_;
    lVar7._0_4_ = pMVar2->offsets_index;
    lVar7._4_4_ = pMVar2->has_bit_indices_index;
    local_50.object_size_ = pMVar2->object_size;
    local_50.default_instance_ = *this->default_instance_data_;
    lVar8 = lVar7 << 0x20;
    piVar6 = (int *)((lVar8 >> 0x1e) + (long)puVar3);
    local_50.offsets_ = (uint32 *)(piVar6 + 5);
    local_50.has_bit_indices_ = puVar3 + (lVar7 >> 0x20);
    local_50.has_bits_offset_ = *piVar6;
    local_50.metadata_offset_ = *(int *)((long)puVar3 + (lVar8 + 0x100000000 >> 0x1e));
    local_50.extensions_offset_ = *(int *)((long)puVar3 + (lVar8 + 0x200000000 >> 0x1e));
    local_50.oneof_case_offset_ = *(int *)((long)puVar3 + (lVar8 + 0x300000000 >> 0x1e));
    local_50.weak_field_map_offset_ = *(int *)((long)puVar3 + (lVar8 + 0x400000000 >> 0x1e));
    pool = DescriptorPool::generated_pool();
    GeneratedMessageReflection::GeneratedMessageReflection
              (this_00,descriptor,&local_50,pool,this->factory_);
    pMVar4 = this->file_level_metadata_;
    pMVar4->reflection = (Reflection *)this_00;
    iVar1 = *(int *)(descriptor + 0x58);
    if (0 < (long)iVar1) {
      ppEVar5 = this->file_level_enum_descriptors_;
      lVar7 = 0;
      do {
        *ppEVar5 = (EnumDescriptor *)(*(long *)(descriptor + 0x60) + lVar7);
        ppEVar5 = this->file_level_enum_descriptors_ + 1;
        this->file_level_enum_descriptors_ = ppEVar5;
        lVar7 = lVar7 + 0x38;
      } while ((long)iVar1 * 0x38 - lVar7 != 0);
      pMVar4 = this->file_level_metadata_;
    }
    this->schemas_ = this->schemas_ + 1;
  }
  this->default_instance_data_ = this->default_instance_data_ + 1;
  this->file_level_metadata_ = pMVar4 + 1;
  return;
}

Assistant:

void AssignMessageDescriptor(const Descriptor* descriptor) {
    for (int i = 0; i < descriptor->nested_type_count(); i++) {
      AssignMessageDescriptor(descriptor->nested_type(i));
    }

    file_level_metadata_->descriptor = descriptor;

    if (!descriptor->options().map_entry()) {
      // Only set reflection for non map types.
      file_level_metadata_->reflection = new GeneratedMessageReflection(
          descriptor, MigrationToReflectionSchema(default_instance_data_,
                                                  offsets_, *schemas_),
          ::google::protobuf::DescriptorPool::generated_pool(), factory_);
      for (int i = 0; i < descriptor->enum_type_count(); i++) {
        AssignEnumDescriptor(descriptor->enum_type(i));
      }
      schemas_++;
    }
    default_instance_data_++;
    file_level_metadata_++;
  }